

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::strTree<char,unsigned_short,char>
          (StringTree *__return_storage_ptr__,kj *this,char *params,unsigned_short *params_1,
          char *params_2)

{
  undefined1 local_2a;
  undefined1 local_29;
  CappedArray<char,_8UL> local_28;
  
  local_29 = *this;
  local_28 = _::Stringifier::operator*((Stringifier *)&_::STR,*(unsigned_short *)params);
  local_2a = (undefined1)*params_1;
  StringTree::concat<kj::FixedArray<char,1ul>,kj::CappedArray<char,8ul>,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,(StringTree *)&local_29,(FixedArray<char,_1UL> *)&local_28,
             (CappedArray<char,_8UL> *)&local_2a,(FixedArray<char,_1UL> *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}